

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::PointwiseMatcher<iutest::detail::TwofoldLtMatcher,_int[2]>::~PointwiseMatcher
          (PointwiseMatcher<iutest::detail::TwofoldLtMatcher,_int[2]> *this)

{
  PointwiseMatcher<iutest::detail::TwofoldLtMatcher,_int[2]> *this_local;
  
  ~PointwiseMatcher(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

class PointwiseMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    PointwiseMatcher(const M& matcher, const T& expected)
        : m_matcher(matcher), m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        IUTEST_USING_BEGIN_END();
        if IUTEST_COND_LIKELY( Check(begin(m_expected), end(m_expected)
            , begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Pointwise: " << m_matcher << ": " << PrintToString(m_expected);
        strm << " (" << m_whichIs << ")";
        return strm.str();
    }